

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  Particle<(pica::Dimension)3> particle;
  bool bVar1;
  AssertionResult gtest_ar;
  int i;
  int numParticles;
  ParticleArray particles;
  AssertHelper *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  Type type;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffe70;
  Message *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_150;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffec0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffed0;
  AssertHelper *pAStack_128;
  int *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int iVar2;
  int iVar3;
  undefined8 in_stack_ffffffffffffff20;
  
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::ParticleArraySoA
            (in_stack_fffffffffffffe70);
  iVar3 = 0xc;
  for (iVar2 = 0; type = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20), iVar2 < iVar3;
      iVar2 = iVar2 + 1) {
    in_stack_fffffffffffffe48 = in_stack_fffffffffffffee0;
    in_stack_fffffffffffffe50 = in_stack_fffffffffffffee8;
    in_stack_fffffffffffffe58 = in_stack_fffffffffffffef0;
    in_stack_fffffffffffffe60 = in_stack_fffffffffffffef8;
    in_stack_fffffffffffffe68 = in_stack_ffffffffffffff00;
    in_stack_fffffffffffffe70 = in_stack_ffffffffffffff08;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (in_stack_fffffffffffffec0);
    particle.position.y = (double)in_stack_fffffffffffffe50;
    particle.position.x = (double)in_stack_fffffffffffffe48;
    particle.position.z = (double)in_stack_fffffffffffffe58;
    particle.p.x = (double)in_stack_fffffffffffffe60;
    particle.p.y = (double)in_stack_fffffffffffffe68;
    particle.p.z = (double)in_stack_fffffffffffffe70;
    particle.factor = (FactorType)in_stack_ffffffffffffff10;
    particle.invGamma._0_4_ = iVar2;
    particle.invGamma._4_4_ = iVar3;
    particle._64_8_ = in_stack_ffffffffffffff20;
    in_stack_fffffffffffffe40 = pAStack_128;
    in_stack_fffffffffffffee0 = in_stack_fffffffffffffe48;
    in_stack_fffffffffffffee8 = in_stack_fffffffffffffe50;
    in_stack_fffffffffffffef0 = in_stack_fffffffffffffe58;
    in_stack_fffffffffffffef8 = in_stack_fffffffffffffe60;
    in_stack_ffffffffffffff00 = in_stack_fffffffffffffe68;
    in_stack_ffffffffffffff08 = in_stack_fffffffffffffe70;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>(in_stack_fffffffffffffed0,particle);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::size
            ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *)0x216f42);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (int *)in_stack_fffffffffffffe40);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    testing::AssertionResult::failure_message((AssertionResult *)0x216f98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe70,type,(char *)in_stack_fffffffffffffe60,
               iVar2,in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0x216fe6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x217058);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA
            (in_stack_fffffffffffffe60);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}